

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# marray.hxx
# Opt level: O3

size_t __thiscall
andres::
UnaryViewExpression<andres::View<int,_true,_std::allocator<unsigned_long>_>,_int,_andres::marray_detail::Negate<int>_>
::dimension(UnaryViewExpression<andres::View<int,_true,_std::allocator<unsigned_long>_>,_int,_andres::marray_detail::Negate<int>_>
            *this)

{
  runtime_error *this_00;
  
  if (this->e_->data_ != (pointer)0x0) {
    return (this->e_->geometry_).dimension_;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this_00,"Assertion failed.");
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

const std::size_t dimension() const 
        { return e_.dimension(); }